

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O3

void Ssc_ManStartSolver(Ssc_Man_t *p)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGVar2;
  uint *puVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  Vec_Int_t *pVVar7;
  uint *__s;
  int *__s_00;
  sat_solver *s;
  uint uVar8;
  long lVar9;
  int iObj;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  
  pAig = Gia_ManToAigSimple(p->pFraig);
  p_00 = Cnf_Derive(pAig,0);
  if ((p->pSat != (sat_solver *)0x0) || (p->vId2Var != (Vec_Int_t *)0x0)) {
    __assert_fail("p->pSat == NULL && p->vId2Var == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                  ,0x10c,"void Ssc_ManStartSolver(Ssc_Man_t *)");
  }
  if (pAig->vObjs->nSize != p->pFraig->nObjs) {
    __assert_fail("Aig_ManObjNumMax(pMan) == Gia_ManObjNum(p->pFraig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                  ,0x10d,"void Ssc_ManStartSolver(Ssc_Man_t *)");
  }
  Aig_ManStop(pAig);
  iVar11 = p_00->nVars;
  p->nSatVars = iVar11;
  p->nSatVarsPivot = iVar11;
  pGVar1 = p->pAig;
  pGVar2 = p->pCare;
  iVar13 = pGVar1->nObjs - pGVar1->vCos->nSize;
  iVar11 = pGVar2->nObjs - pGVar2->vCos->nSize;
  uVar8 = iVar13 + iVar11 + 8;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar12 = iVar11 + iVar13 + 7;
  uVar5 = 0x10;
  if (0xe < uVar12) {
    uVar5 = uVar8;
  }
  pVVar7->nCap = uVar5;
  if (uVar5 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = uVar8;
LAB_006427a7:
    __s = (uint *)0x0;
    uVar5 = uVar8;
  }
  else {
    __s = (uint *)malloc((long)(int)uVar5 << 2);
    pVVar7->pArray = (int *)__s;
    pVVar7->nSize = uVar8;
    if (__s == (uint *)0x0) goto LAB_006427a7;
    memset(__s,0,(long)(int)uVar8 << 2);
    iVar11 = pGVar1->nObjs - pGVar1->vCos->nSize;
    iVar13 = pGVar2->nObjs - pGVar2->vCos->nSize;
    uVar12 = iVar11 + iVar13 + 7;
    uVar5 = iVar13 + iVar11 + 8;
  }
  p->vId2Var = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0xe < uVar12) {
    uVar6 = uVar5;
  }
  pVVar7->nCap = uVar6;
  if (uVar6 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = uVar5;
  }
  else {
    __s_00 = (int *)malloc((long)(int)uVar6 << 2);
    pVVar7->pArray = __s_00;
    pVVar7->nSize = uVar5;
    if (__s_00 != (int *)0x0) {
      memset(__s_00,0,(long)(int)uVar5 << 2);
      goto LAB_0064281a;
    }
  }
  __s_00 = (int *)0x0;
LAB_0064281a:
  p->vVar2Id = pVVar7;
  if (0 < (int)uVar8) {
    puVar3 = (uint *)p_00->pVarNums;
    uVar12 = *puVar3;
    *__s = uVar12;
    if ((-1 < (int)uVar12) && ((int)uVar12 < (int)uVar5)) {
      __s_00[uVar12] = 0;
      pGVar1 = p->pFraig;
      pVVar7 = pGVar1->vCis;
      if (0 < pVVar7->nSize) {
        piVar4 = pVVar7->pArray;
        lVar9 = 0;
        do {
          uVar12 = piVar4[lVar9];
          lVar10 = (long)(int)uVar12;
          if ((lVar10 < 0) || (pGVar1->nObjs <= (int)uVar12)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar1->pObjs == (Gia_Obj_t *)0x0) break;
          if (uVar8 <= uVar12) goto LAB_0064293f;
          uVar6 = puVar3[lVar10];
          __s[lVar10] = uVar6;
          if (((int)uVar6 < 0) || (uVar5 <= uVar6)) goto LAB_0064293f;
          __s_00[uVar6] = uVar12;
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar7->nSize);
      }
      s = sat_solver_new();
      sat_solver_setnvars(s,p_00->nVars + 1000);
      lVar9 = 0;
      do {
        if (p_00->nClauses <= lVar9) {
          Cnf_DataFree(p_00);
          iVar11 = sat_solver_simplify(s);
          if (iVar11 != 0) {
            p->pSat = s;
            return;
          }
          goto LAB_00642929;
        }
        iVar11 = sat_solver_addclause(s,p_00->pClauses[lVar9],p_00->pClauses[lVar9 + 1]);
        lVar9 = lVar9 + 1;
      } while (iVar11 != 0);
      Cnf_DataFree(p_00);
LAB_00642929:
      sat_solver_delete(s);
      return;
    }
  }
LAB_0064293f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Ssc_ManStartSolver( Ssc_Man_t * p )
{
    Aig_Man_t * pMan = Gia_ManToAigSimple( p->pFraig );
    Cnf_Dat_t * pDat = Cnf_Derive( pMan, 0 );
    Gia_Obj_t * pObj;
    sat_solver * pSat;
    int i, status;
    assert( p->pSat == NULL && p->vId2Var == NULL );
    assert( Aig_ManObjNumMax(pMan) == Gia_ManObjNum(p->pFraig) );
    Aig_ManStop( pMan );
    // save variable mapping
    p->nSatVarsPivot = p->nSatVars = pDat->nVars;
    p->vId2Var = Vec_IntStart( Gia_ManCandNum(p->pAig) + Gia_ManCandNum(p->pCare) + 10 ); // mapping of each node into its SAT var
    p->vVar2Id = Vec_IntStart( Gia_ManCandNum(p->pAig) + Gia_ManCandNum(p->pCare) + 10 ); // mapping of each SAT var into its node
    Ssc_ObjSetSatVar( p, 0, pDat->pVarNums[0] );
    Gia_ManForEachCi( p->pFraig, pObj, i )
    {
        int iObj = Gia_ObjId( p->pFraig, pObj );
        Ssc_ObjSetSatVar( p, iObj, pDat->pVarNums[iObj] );
    }
//Cnf_DataWriteIntoFile( pDat, "dump.cnf", 1, NULL, NULL );
    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pDat->nVars + 1000 );
    for ( i = 0; i < pDat->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pDat->pClauses[i], pDat->pClauses[i+1] ) )
        {
            Cnf_DataFree( pDat );
            sat_solver_delete( pSat );
            return;
        }
    }
    Cnf_DataFree( pDat );
    status = sat_solver_simplify( pSat );
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
        return;
    }
    p->pSat = pSat;
}